

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvd.inc.c
# Opt level: O3

_Bool trans_fmin_d(DisasContext_conflict12 *ctx,arg_fmin_d *a)

{
  TCGContext_conflict11 *tcg_ctx;
  bool bVar1;
  TCGTemp *local_28;
  TCGv_i64 local_20;
  TCGv_i64 local_18;
  
  if (ctx->mstatus_fs == 0) {
    return false;
  }
  bVar1 = (ctx->misa & 8) != 0;
  if (bVar1) {
    tcg_ctx = ctx->uc->tcg_ctx;
    local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_20 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_fpr[a->rs1]);
    local_18 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_fpr[a->rs2]);
    tcg_gen_callN_riscv64
              (tcg_ctx,helper_fmin_d_riscv64,
               (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_fpr[a->rd]),3,&local_28);
    mark_fs_dirty(ctx);
  }
  return bVar1;
}

Assistant:

static bool trans_fmin_d(DisasContext *ctx, arg_fmin_d *a)
{
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVD);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    gen_helper_fmin_d(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_env,
                      tcg_ctx->cpu_fpr[a->rs1], tcg_ctx->cpu_fpr[a->rs2]);

    mark_fs_dirty(ctx);
    return true;
}